

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_zoh.c
# Opt level: O0

SRC_ERROR zoh_vari_process(SRC_STATE *state,SRC_DATA *data)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  int local_44;
  int ch;
  double rem;
  double input_index;
  double src_ratio;
  ZOH_DATA *priv;
  SRC_DATA *data_local;
  SRC_STATE *state_local;
  
  if (data->input_frames < 1) {
    state_local._4_4_ = SRC_ERR_NO_ERROR;
  }
  else if (state->private_data == (void *)0x0) {
    state_local._4_4_ = SRC_ERR_NO_PRIVATE;
  }
  else {
    pvVar1 = state->private_data;
    if ((*(byte *)((long)pvVar1 + 4) & 1) == 0) {
      for (local_44 = 0; local_44 < state->channels; local_44 = local_44 + 1) {
        *(float *)(*(long *)((long)pvVar1 + 0x28) + (long)local_44 * 4) = data->data_in[local_44];
      }
      *(undefined1 *)((long)pvVar1 + 4) = 1;
    }
    *(long *)((long)pvVar1 + 8) = data->input_frames * (long)state->channels;
    *(long *)((long)pvVar1 + 0x18) = data->output_frames * (long)state->channels;
    *(undefined8 *)((long)pvVar1 + 0x20) = 0;
    *(undefined8 *)((long)pvVar1 + 0x10) = 0;
    input_index = state->last_ratio;
    iVar3 = is_bad_src_ratio(input_index);
    if (iVar3 == 0) {
      rem = state->last_position;
      while( true ) {
        bVar2 = false;
        if (rem < 1.0) {
          bVar2 = *(long *)((long)pvVar1 + 0x20) < *(long *)((long)pvVar1 + 0x18);
        }
        if ((!bVar2) ||
           ((double)*(long *)((long)pvVar1 + 8) <=
            (double)state->channels * rem + (double)*(long *)((long)pvVar1 + 0x10))) break;
        if ((0 < *(long *)((long)pvVar1 + 0x18)) &&
           (1e-20 < ABS(state->last_ratio - data->src_ratio))) {
          input_index = state->last_ratio +
                        ((double)*(long *)((long)pvVar1 + 0x20) *
                        (data->src_ratio - state->last_ratio)) /
                        (double)*(long *)((long)pvVar1 + 0x18);
        }
        for (local_44 = 0; local_44 < state->channels; local_44 = local_44 + 1) {
          data->data_out[*(long *)((long)pvVar1 + 0x20)] =
               *(float *)(*(long *)((long)pvVar1 + 0x28) + (long)local_44 * 4);
          *(long *)((long)pvVar1 + 0x20) = *(long *)((long)pvVar1 + 0x20) + 1;
        }
        rem = 1.0 / input_index + rem;
      }
      dVar5 = fmod_one(rem);
      iVar3 = state->channels;
      iVar4 = psf_lrint(rem - dVar5);
      *(long *)((long)pvVar1 + 0x10) = (long)(iVar3 * iVar4) + *(long *)((long)pvVar1 + 0x10);
      rem = dVar5;
      while( true ) {
        bVar2 = false;
        if (*(long *)((long)pvVar1 + 0x20) < *(long *)((long)pvVar1 + 0x18)) {
          bVar2 = (double)state->channels * rem + (double)*(long *)((long)pvVar1 + 0x10) <=
                  (double)*(long *)((long)pvVar1 + 8);
        }
        if (!bVar2) break;
        if ((0 < *(long *)((long)pvVar1 + 0x18)) &&
           (1e-20 < ABS(state->last_ratio - data->src_ratio))) {
          input_index = state->last_ratio +
                        ((double)*(long *)((long)pvVar1 + 0x20) *
                        (data->src_ratio - state->last_ratio)) /
                        (double)*(long *)((long)pvVar1 + 0x18);
        }
        for (local_44 = 0; local_44 < state->channels; local_44 = local_44 + 1) {
          data->data_out[*(long *)((long)pvVar1 + 0x20)] =
               data->data_in
               [(*(long *)((long)pvVar1 + 0x10) - (long)state->channels) + (long)local_44];
          *(long *)((long)pvVar1 + 0x20) = *(long *)((long)pvVar1 + 0x20) + 1;
        }
        dVar5 = 1.0 / input_index + rem;
        rem = fmod_one(dVar5);
        iVar3 = state->channels;
        iVar4 = psf_lrint(dVar5 - rem);
        *(long *)((long)pvVar1 + 0x10) = (long)(iVar3 * iVar4) + *(long *)((long)pvVar1 + 0x10);
      }
      if (*(long *)((long)pvVar1 + 8) < *(long *)((long)pvVar1 + 0x10)) {
        rem = (double)((*(long *)((long)pvVar1 + 0x10) - *(long *)((long)pvVar1 + 8)) /
                      (long)state->channels) + rem;
        *(undefined8 *)((long)pvVar1 + 0x10) = *(undefined8 *)((long)pvVar1 + 8);
      }
      state->last_position = rem;
      if (0 < *(long *)((long)pvVar1 + 0x10)) {
        for (local_44 = 0; local_44 < state->channels; local_44 = local_44 + 1) {
          *(float *)(*(long *)((long)pvVar1 + 0x28) + (long)local_44 * 4) =
               data->data_in
               [(*(long *)((long)pvVar1 + 0x10) - (long)state->channels) + (long)local_44];
        }
      }
      state->last_ratio = input_index;
      data->input_frames_used = *(long *)((long)pvVar1 + 0x10) / (long)state->channels;
      data->output_frames_gen = *(long *)((long)pvVar1 + 0x20) / (long)state->channels;
      state_local._4_4_ = SRC_ERR_NO_ERROR;
    }
    else {
      state_local._4_4_ = SRC_ERR_BAD_INTERNAL_STATE;
    }
  }
  return state_local._4_4_;
}

Assistant:

static SRC_ERROR
zoh_vari_process (SRC_STATE *state, SRC_DATA *data)
{	ZOH_DATA 	*priv ;
	double		src_ratio, input_index, rem ;
	int			ch ;

	if (data->input_frames <= 0)
		return SRC_ERR_NO_ERROR ;

	if (state->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	priv = (ZOH_DATA*) state->private_data ;

	if (!priv->dirty)
	{	/* If we have just been reset, set the last_value data. */
		for (ch = 0 ; ch < state->channels ; ch++)
			priv->last_value [ch] = data->data_in [ch] ;
		priv->dirty = true ;
		} ;

	priv->in_count = data->input_frames * state->channels ;
	priv->out_count = data->output_frames * state->channels ;
	priv->in_used = priv->out_gen = 0 ;

	src_ratio = state->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	input_index = state->last_position ;

	/* Calculate samples before first sample in input array. */
	while (input_index < 1.0 && priv->out_gen < priv->out_count)
	{
		if (priv->in_used + state->channels * input_index >= priv->in_count)
			break ;

		if (priv->out_count > 0 && fabs (state->last_ratio - data->src_ratio) > SRC_MIN_RATIO_DIFF)
			src_ratio = state->last_ratio + priv->out_gen * (data->src_ratio - state->last_ratio) / priv->out_count ;

		for (ch = 0 ; ch < state->channels ; ch++)
		{	data->data_out [priv->out_gen] = priv->last_value [ch] ;
			priv->out_gen ++ ;
			} ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		} ;

	rem = fmod_one (input_index) ;
	priv->in_used += state->channels * psf_lrint (input_index - rem) ;
	input_index = rem ;

	/* Main processing loop. */
	while (priv->out_gen < priv->out_count && priv->in_used + state->channels * input_index <= priv->in_count)
	{
		if (priv->out_count > 0 && fabs (state->last_ratio - data->src_ratio) > SRC_MIN_RATIO_DIFF)
			src_ratio = state->last_ratio + priv->out_gen * (data->src_ratio - state->last_ratio) / priv->out_count ;

		for (ch = 0 ; ch < state->channels ; ch++)
		{	data->data_out [priv->out_gen] = data->data_in [priv->in_used - state->channels + ch] ;
			priv->out_gen ++ ;
			} ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		priv->in_used += state->channels * psf_lrint (input_index - rem) ;
		input_index = rem ;
		} ;

	if (priv->in_used > priv->in_count)
	{	input_index += (priv->in_used - priv->in_count) / state->channels ;
		priv->in_used = priv->in_count ;
		} ;

	state->last_position = input_index ;

	if (priv->in_used > 0)
		for (ch = 0 ; ch < state->channels ; ch++)
			priv->last_value [ch] = data->data_in [priv->in_used - state->channels + ch] ;

	/* Save current ratio rather then target ratio. */
	state->last_ratio = src_ratio ;

	data->input_frames_used = priv->in_used / state->channels ;
	data->output_frames_gen = priv->out_gen / state->channels ;

	return SRC_ERR_NO_ERROR ;
}